

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<unsigned_long,_false,_long>::BitpackingWriter::
     WriteConstantDelta(long constant,unsigned_long frame_of_reference,idx_t count,
                       unsigned_long *values,bool *validity,void *data_ptr)

{
  BitpackingCompressionState<unsigned_long,_false,_long> *in_RCX;
  unsigned_long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  BitpackingMode mode;
  BitpackingCompressionState<unsigned_long,_false,_long> *in_R9;
  BitpackingCompressionState<unsigned_long,_false,_long> *state;
  BitpackingCompressionState<unsigned_long,_false,_long> *state_00;
  
  mode = (BitpackingMode)((ulong)in_R8 >> 0x38);
  state_00 = in_R9;
  ReserveSpace(in_R9,(idx_t)in_R9);
  WriteMetaData(in_RCX,mode);
  WriteData<unsigned_long>(&in_R9->data_ptr,in_RSI);
  WriteData<long>(&in_R9->data_ptr,in_RDI);
  UpdateStats(state_00,(idx_t)in_R9);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}